

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::response_read
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,ptr<buffer> *resp_buf,
          error_code err,size_t bytes_transferred)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  element_type *peVar5;
  byte *data;
  element_type *peVar6;
  _Placeholder<1> *__args_6;
  uint *__args_5;
  options *poVar7;
  shared_ptr<nuraft::asio_rpc_client> *__args;
  bool *in_RSI;
  asio_rpc_client *in_RDI;
  ptr<rpc_exception> except_2;
  ptr<buffer> ctx_buf;
  bool meta_ok;
  ptr<resp_msg> rsp;
  int32 carried_data_size;
  byte accepted_val;
  ulong nxt_idx;
  ulong term;
  int32 dst;
  int32 src;
  byte msg_type_val;
  ptr<rpc_exception> except_1;
  ptr<resp_msg> rsp_2;
  uint32_t flags;
  uint32_t crc_buf;
  uint64_t flags_and_crc;
  uint32_t crc_local;
  buffer_serializer bs;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp_1;
  ptr<asio_rpc_client> self;
  enable_shared_from_this<nuraft::asio_rpc_client> *in_stack_fffffffffffffc28;
  undefined1 *size_in_bytes;
  shared_ptr<nuraft::req_msg> *in_stack_fffffffffffffc30;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>
  *func;
  ptr<buffer> *in_stack_fffffffffffffc38;
  mutable_buffers_1 *buffer;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffc40;
  socket *tcp_socket;
  ssl_socket *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  undefined1 uVar8;
  unsigned_long *in_stack_fffffffffffffc58;
  int iVar9;
  ssl_socket *__args_2;
  strfmt<100> *in_stack_fffffffffffffc60;
  socket *__args_1;
  bool *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc94;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffcb4;
  string *in_stack_fffffffffffffd28;
  rpc_handler *in_stack_fffffffffffffd30;
  ptr<resp_msg> *in_stack_fffffffffffffd38;
  ptr<req_msg> *in_stack_fffffffffffffd40;
  asio_rpc_client *in_stack_fffffffffffffd48;
  size_t in_stack_fffffffffffffd78;
  string local_238 [34];
  undefined1 local_216;
  undefined1 local_215;
  uint local_214;
  int32_t local_200;
  uint8_t local_1f9;
  uint *local_1f8;
  _Placeholder<1> *local_1f0;
  int32_t local_1e4;
  int32_t local_1e0;
  byte local_1d9;
  strfmt<100> local_1d8;
  char *local_168;
  undefined1 local_140 [104];
  strfmt<100> local_d8;
  char *local_68;
  bool *local_20;
  error_code local_10;
  
  local_20 = in_RSI;
  std::enable_shared_from_this<nuraft::asio_rpc_client>::shared_from_this(in_stack_fffffffffffffc28)
  ;
  uVar8 = (undefined1)((ulong)in_stack_fffffffffffffc28 >> 0x38);
  bVar1 = std::error_code::operator_cast_to_bool(&local_10);
  if (bVar1) {
    std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffc30,(bool)uVar8);
    iVar9 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1c7a0c);
    strfmt<100>::strfmt(&local_d8,"failed to read response to peer %d, %s:%s, error %d, %s");
    peVar6 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1c7a2f);
    msg_base::get_dst(&peVar6->super_msg_base);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::error_code::value(&local_10);
    std::error_code::message_abi_cxx11_((error_code *)in_stack_fffffffffffffc48);
    std::__cxx11::string::c_str();
    local_68 = strfmt<100>::fmt<int,char_const*,char_const*,int,char_const*>
                         (in_stack_fffffffffffffc60,iVar9,
                          (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                          (char *)in_stack_fffffffffffffc48,
                          (int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                          (char *)in_stack_fffffffffffffc38);
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    std::__cxx11::string::~string((string *)(local_140 + 0x38));
    close_socket(in_RDI);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(in_stack_fffffffffffffc40,(shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffc38,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffc30);
    local_140._52_4_ = 1;
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x1c7b5d);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1c7b6a);
    goto LAB_001c8311;
  }
  buffer_serializer::buffer_serializer
            ((buffer_serializer *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (endianness)((ulong)in_stack_fffffffffffffc30 >> 0x20));
  peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1c7c01);
  data = nuraft::buffer::data_begin(peVar5);
  local_140._20_4_ = crc32_8(data,0x1f,0);
  buffer_serializer::pos
            ((buffer_serializer *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (size_t)in_stack_fffffffffffffc48);
  local_140._8_8_ = buffer_serializer::get_u64((buffer_serializer *)in_stack_fffffffffffffc60);
  local_140._4_4_ = (undefined4)local_140._8_8_;
  local_140._0_4_ = (undefined4)((ulong)local_140._8_8_ >> 0x20);
  if (local_140._20_4_ != local_140._4_4_) {
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1c7cc6);
    iVar9 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    strfmt<100>::strfmt(&local_1d8,
                        "CRC mismatch in response from peer %d, %s:%s, local calculation %x, from buffer %x"
                       );
    peVar6 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1c7ce9);
    msg_base::get_dst(&peVar6->super_msg_base);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    local_168 = strfmt<100>::fmt<int,char_const*,char_const*,unsigned_int,unsigned_int>
                          (in_stack_fffffffffffffc60,iVar9,
                           (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                           (char *)in_stack_fffffffffffffc48,
                           (uint)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                           (uint)in_stack_fffffffffffffc40);
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    close_socket(in_RDI);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(in_stack_fffffffffffffc40,(shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffc38,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffc30);
    local_140._52_4_ = 1;
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x1c7dd4);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1c7de1);
    goto LAB_001c8311;
  }
  buffer_serializer::pos
            ((buffer_serializer *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (size_t)in_stack_fffffffffffffc48);
  local_1d9 = buffer_serializer::get_u8
                        ((buffer_serializer *)
                         CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  uVar11 = CONCAT13(local_1d9,(int3)in_stack_fffffffffffffcb0);
  iVar2 = buffer_serializer::get_i32((buffer_serializer *)in_stack_fffffffffffffc60);
  local_1e0 = iVar2;
  iVar3 = buffer_serializer::get_i32((buffer_serializer *)in_stack_fffffffffffffc60);
  local_1e4 = iVar3;
  __args_6 = (_Placeholder<1> *)
             buffer_serializer::get_u64((buffer_serializer *)in_stack_fffffffffffffc60);
  local_1f0 = __args_6;
  __args_5 = (uint *)buffer_serializer::get_u64((buffer_serializer *)in_stack_fffffffffffffc60);
  local_1f8 = __args_5;
  local_1f9 = buffer_serializer::get_u8
                        ((buffer_serializer *)
                         CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  uVar10 = CONCAT13(local_1f9,(int3)in_stack_fffffffffffffc94);
  iVar4 = buffer_serializer::get_i32((buffer_serializer *)in_stack_fffffffffffffc60);
  local_214 = (uint)local_1d9;
  local_215 = local_1f9 == '\x01';
  size_in_bytes = &local_215;
  local_200 = iVar4;
  cs_new<nuraft::resp_msg,unsigned_long&,nuraft::msg_type,int&,int&,unsigned_long&,bool>
            (in_stack_fffffffffffffc58,
             (msg_type *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (int *)in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40,
             (unsigned_long *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc70);
  if ((local_140._0_4_ & 1) == 0) {
    asio_service_impl::get_options(in_RDI->impl_);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)0x1c7fde);
    if ((!bVar1) ||
       (poVar7 = asio_service_impl::get_options(in_RDI->impl_),
       (poVar7->invoke_resp_cb_on_empty_meta_ & 1U) == 0)) goto LAB_001c80b7;
    std::__cxx11::string::string(local_238);
    bVar1 = handle_custom_resp_meta
                      (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38
                       ,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_238);
    in_stack_fffffffffffffc70 = local_20;
    local_216 = bVar1;
    if (bVar1) goto LAB_001c80b7;
    local_140._52_4_ = 1;
  }
  else {
LAB_001c80b7:
    if (local_200 == 0) {
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::cancel((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      set_busy_flag((asio_rpc_client *)CONCAT44(in_stack_fffffffffffffcb4,uVar11),
                    SUB41((uint)iVar2 >> 0x18,0));
      std::shared_ptr<nuraft::rpc_exception>::shared_ptr
                ((shared_ptr<nuraft::rpc_exception> *)0x1c82ab);
      std::
      function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::operator()(in_stack_fffffffffffffc40,
                   (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffc38,
                   (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffc30);
      std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
                ((shared_ptr<nuraft::rpc_exception> *)0x1c82d4);
    }
    else {
      nuraft::buffer::alloc(in_stack_fffffffffffffd78);
      uVar8 = in_RDI->ssl_enabled_;
      __args_2 = &in_RDI->ssl_socket_;
      __args_1 = &in_RDI->socket_;
      peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1c8113);
      __args = (shared_ptr<nuraft::asio_rpc_client> *)nuraft::buffer::data(peVar5);
      asio::buffer(in_stack_fffffffffffffc30,(size_t)size_in_bytes);
      tcp_socket = (socket *)&std::placeholders::_2;
      buffer = (mutable_buffers_1 *)&std::placeholders::_1;
      func = (_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>
              *)local_140;
      std::
      bind<void(nuraft::asio_rpc_client::*)(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int,std::error_code,unsigned_long),std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((offset_in_asio_rpc_client_to_subr *)in_stack_fffffffffffffc70,__args,
                 (shared_ptr<nuraft::req_msg> *)__args_1,(shared_ptr<nuraft::resp_msg> *)__args_2,
                 (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)CONCAT17(uVar8,in_stack_fffffffffffffc50),
                 (shared_ptr<nuraft::buffer> *)CONCAT44(uVar10,iVar4),__args_5,__args_6,
                 (_Placeholder<2> *)CONCAT44(iVar2,iVar3));
      aa::
      read<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int,std::error_code,unsigned_long)>>
                ((bool)uVar8,in_stack_fffffffffffffc48,tcp_socket,buffer,func);
      std::
      _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>
      ::~_Bind((_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>
                *)0x1c81fe);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1c820b);
    }
    local_140._52_4_ = 0;
  }
  std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1c8311);
LAB_001c8311:
  std::shared_ptr<nuraft::asio_rpc_client>::~shared_ptr
            ((shared_ptr<nuraft::asio_rpc_client> *)0x1c831e);
  return;
}

Assistant:

void response_read(ptr<req_msg>& req,
                       rpc_handler& when_done,
                       ptr<buffer>& resp_buf,
                       std::error_code err,
                       size_t bytes_transferred)
    {
        ptr<asio_rpc_client> self(this->shared_from_this());
        if (err) {
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "failed to read response to peer %d, %s:%s, "
                             "error %d, %s" )
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
            return;
        }

        buffer_serializer bs(resp_buf);
        uint32_t crc_local = crc32_8( resp_buf->data_begin(),
                                      RPC_RESP_HEADER_SIZE - CRC_FLAGS_LEN,
                                      0 );
        bs.pos(RPC_RESP_HEADER_SIZE - CRC_FLAGS_LEN);
        uint64_t flags_and_crc = bs.get_u64();
        uint32_t crc_buf = flags_and_crc & (uint32_t)0xffffffff;
        uint32_t flags = (flags_and_crc >> 32);

        if (crc_local != crc_buf) {
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "CRC mismatch in response from peer %d, %s:%s, "
                             "local calculation %x, from buffer %x")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), crc_local, crc_buf ),
                    req ) );
            close_socket();
            when_done(rsp, except);
            return;
        }

        bs.pos(1);
        byte msg_type_val = bs.get_u8();
        int32 src = bs.get_i32();
        int32 dst = bs.get_i32();
        ulong term = bs.get_u64();
        ulong nxt_idx = bs.get_u64();
        byte accepted_val = bs.get_u8();
        int32 carried_data_size = bs.get_i32();
        ptr<resp_msg> rsp
            ( cs_new<resp_msg>
              ( term, (msg_type)msg_type_val, src, dst,
                nxt_idx, accepted_val == 1 ) );

        if ( !(flags & INCLUDE_META) &&
             impl_->get_options().read_resp_meta_ &&
             impl_->get_options().invoke_resp_cb_on_empty_meta_ ) {
            // If callback is given, but meta is empty, and
            // the "always invoke" flag is set, invoke it.
            bool meta_ok = handle_custom_resp_meta
                           ( req, rsp, when_done, std::string() );
            if (!meta_ok) return;
        }

        if (carried_data_size) {
            ptr<buffer> ctx_buf = buffer::alloc(carried_data_size);
            aa::read( ssl_enabled_, ssl_socket_, socket_,
                      asio::buffer(ctx_buf->data(), carried_data_size),
                      std::bind( &asio_rpc_client::ctx_read,
                                 self,
                                 req,
                                 rsp,
                                 when_done,
                                 ctx_buf,
                                 flags,
                                 std::placeholders::_1,
                                 std::placeholders::_2 ) );
        } else {
            operation_timer_.cancel();
            set_busy_flag(false);
            ptr<rpc_exception> except;
            when_done(rsp, except);
        }
    }